

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O0

bool __thiscall MT32Emu::Poly::startDecay(Poly *this)

{
  Partial *partial;
  int t;
  Poly *this_local;
  
  if ((this->state == POLY_Inactive) || (this->state == POLY_Releasing)) {
    this_local._7_1_ = false;
  }
  else {
    setState(this,POLY_Releasing);
    for (partial._4_4_ = 0; partial._4_4_ < 4; partial._4_4_ = partial._4_4_ + 1) {
      if (this->partials[partial._4_4_] != (Partial *)0x0) {
        Partial::startDecayAll(this->partials[partial._4_4_]);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Poly::startDecay() {
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	setState(POLY_Releasing);

	for (int t = 0; t < 4; t++) {
		Partial *partial = partials[t];
		if (partial != NULL) {
			partial->startDecayAll();
		}
	}
	return true;
}